

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O1

void aom_highbd_quantize_b_32x32_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  short sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  ulong uVar38;
  uint uVar39;
  long lVar40;
  int iVar41;
  uint uVar42;
  uint16_t uVar43;
  short *psVar44;
  ulong uVar45;
  bool bVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined8 local_1c0;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  
  auVar50 = vpsraw_avx(ZEXT416(*(uint *)zbin_ptr),1);
  auVar3 = vpand_avx(ZEXT416(*(uint *)zbin_ptr),_DAT_00510480);
  auVar3 = vpaddw_avx(auVar3,auVar50);
  auVar50 = vpmovsxwd_avx(auVar3);
  local_1c0 = auVar50._0_8_;
  auVar3 = vpmovzxwd_avx(ZEXT416(*(uint *)dequant_ptr));
  auVar3 = vpmaddwd_avx(auVar3,_DAT_0050f7a0);
  auVar52._8_4_ = 0x40;
  auVar52._0_8_ = 0x4000000040;
  auVar52._12_4_ = 0x40;
  auVar3 = vpaddd_avx(auVar3,auVar52);
  auVar51 = vpsrad_avx(auVar3,7);
  auVar50 = vpslld_avx(auVar50,5);
  auVar3 = vpcmpeqd_avx(auVar52,auVar52);
  auVar3 = vpaddd_avx(auVar50,auVar3);
  auVar3 = vpaddd_avx(auVar3,auVar51);
  auVar50 = vpshufd_avx(auVar3,0x55);
  auVar47._0_8_ = auVar50._0_8_;
  auVar47._8_8_ = auVar47._0_8_;
  auVar47._16_8_ = auVar47._0_8_;
  auVar47._24_8_ = auVar47._0_8_;
  auVar55 = vpmovsxwd_avx2(*(undefined1 (*) [16])zbin_ptr);
  auVar58 = vpmovsxwd_avx2(*(undefined1 (*) [16])round_ptr);
  auVar62 = vpblendd_avx2(auVar47,ZEXT1632(auVar3),1);
  auVar56 = vpcmpeqd_avx2(in_ZMM8._0_32_,in_ZMM8._0_32_);
  auVar55 = vpsubd_avx2(auVar55,auVar56);
  auVar54 = vpsrld_avx2(auVar55,1);
  auVar53 = vpaddd_avx2(auVar56,auVar54);
  auVar55 = vpabsd_avx2(*(undefined1 (*) [32])coeff_ptr);
  auVar57 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar60 = vpslld_avx2(auVar55,5);
  auVar62 = vpcmpgtd_avx2(auVar60,auVar62);
  auVar60 = vpslld_avx2(auVar57,5);
  auVar60 = vpcmpgtd_avx2(auVar60,auVar47);
  auVar62 = vpackssdw_avx2(auVar62,auVar60);
  auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar60 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  bVar35 = (auVar62 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar36 = (auVar62 >> 0xf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar34 = (auVar62 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar33 = (auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar32 = (auVar62 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar31 = (auVar62 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar30 = (auVar62 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar29 = (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar28 = (auVar62 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar27 = (auVar62 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar26 = (auVar62 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar25 = (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar24 = (auVar62 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar23 = (auVar62 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar22 = (auVar62 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar21 = SUB321(auVar62 >> 0x7f,0) != '\0';
  bVar20 = (auVar62 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar19 = (auVar62 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar18 = (auVar62 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar17 = (auVar62 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar16 = (auVar62 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar15 = (auVar62 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar14 = (auVar62 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar13 = SUB321(auVar62 >> 0xbf,0) != '\0';
  bVar12 = (auVar62 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar11 = (auVar62 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar10 = (auVar62 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar9 = (auVar62 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar8 = (auVar62 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar7 = (auVar62 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar6 = (auVar62 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar46 = auVar62[0x1f] < '\0';
  if (((((((((((((((((((((((((((((((bVar35 || bVar36) || bVar34) || bVar33) || bVar32) || bVar31) ||
                              bVar30) || bVar29) || bVar28) || bVar27) || bVar26) || bVar25) ||
                        bVar24) || bVar23) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) ||
                 bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) || bVar10
          ) || bVar9) || bVar8) || bVar7) || bVar6) || bVar46) {
    auVar62 = vpermq_avx2(auVar62,0xd8);
    auVar60 = vpand_avx2(auVar62,*(undefined1 (*) [32])iscan);
  }
  bVar46 = ((((((((((((((((((((((((((((((bVar35 || bVar36) || bVar34) || bVar33) || bVar32) ||
                                    bVar31) || bVar30) || bVar29) || bVar28) || bVar27) || bVar26)
                              || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) ||
                        bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) ||
                 bVar12) || bVar11) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) || bVar46;
  auVar65 = vpsubd_avx2(auVar58,auVar56);
  auVar58 = vpcmpgtd_avx2(auVar54,auVar55);
  auVar5 = vpermq_avx2(auVar53,0xee);
  auVar54 = vpcmpgtd_avx2(auVar57,auVar5);
  auVar62 = vpackssdw_avx2(auVar56 ^ auVar58,auVar54);
  auVar56 = vpermq_avx2(auVar62,0xd8);
  auVar53 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  bVar36 = (auVar62 >> 7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar37 = (auVar62 >> 0xf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar35 = (auVar62 >> 0x17 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar34 = (auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar33 = (auVar62 >> 0x27 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar32 = (auVar62 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar31 = (auVar62 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar30 = (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar29 = (auVar62 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar28 = (auVar62 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar27 = (auVar62 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar26 = (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar25 = (auVar62 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar24 = (auVar62 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar23 = (auVar62 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar22 = SUB321(auVar62 >> 0x7f,0) != '\0';
  bVar21 = (auVar62 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar20 = (auVar62 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar19 = (auVar62 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar18 = (auVar62 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar17 = (auVar62 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar16 = (auVar62 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar15 = (auVar62 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar14 = SUB321(auVar62 >> 0xbf,0) != '\0';
  bVar13 = (auVar62 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar12 = (auVar62 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar11 = (auVar62 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar10 = (auVar62 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar9 = (auVar62 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar8 = (auVar62 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar7 = (auVar62 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0;
  bVar6 = auVar62[0x1f] < '\0';
  if (((((((((((((((((((((((((((((((bVar36 || bVar37) || bVar35) || bVar34) || bVar33) || bVar32) ||
                              bVar31) || bVar30) || bVar29) || bVar28) || bVar27) || bVar26) ||
                        bVar25) || bVar24) || bVar23) || bVar22) || bVar21) || bVar20) || bVar19) ||
                 bVar18) || bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11
          ) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) {
    auVar53 = vpand_avx2(auVar56,*(undefined1 (*) [32])iscan);
  }
  bVar6 = ((((((((((((((((((((((((((((((bVar36 || bVar37) || bVar35) || bVar34) || bVar33) || bVar32
                                   ) || bVar31) || bVar30) || bVar29) || bVar28) || bVar27) ||
                             bVar26) || bVar25) || bVar24) || bVar23) || bVar22) || bVar21) ||
                       bVar20) || bVar19) || bVar18) || bVar17) || bVar16) || bVar15) || bVar14) ||
                bVar13) || bVar12) || bVar11) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6;
  auVar62 = vpmovsxwd_avx2(*(undefined1 (*) [16])quant_ptr);
  auVar4 = vpmovsxwd_avx2(*(undefined1 (*) [16])dequant_ptr);
  auVar49 = vpmovsxwd_avx2(*(undefined1 (*) [16])quant_shift_ptr);
  auVar65 = vpsrld_avx2(auVar65,1);
  if ((((((((((((((((((((((((((((((((auVar56 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar56 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar56 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar56 >> 0x1f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar56 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar56 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar56 >> 0x37 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar56 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar56 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar56 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar56 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar56 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar56 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar56 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar56 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar56 >> 0x7f,0) == '\0') &&
                    (auVar56 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar56 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar56 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar56 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar56 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar56 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar56 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar56 >> 0xbf,0) == '\0') &&
            (auVar56 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar56 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar56 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar56 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar56 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar56 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar56 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar56[0x1f]) {
    qcoeff_ptr[8] = 0;
    qcoeff_ptr[9] = 0;
    qcoeff_ptr[10] = 0;
    qcoeff_ptr[0xb] = 0;
    qcoeff_ptr[0xc] = 0;
    qcoeff_ptr[0xd] = 0;
    qcoeff_ptr[0xe] = 0;
    qcoeff_ptr[0xf] = 0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    qcoeff_ptr[4] = 0;
    qcoeff_ptr[5] = 0;
    qcoeff_ptr[6] = 0;
    qcoeff_ptr[7] = 0;
    local_158 = vpermq_avx2(auVar65,0xee);
    local_178 = vpermq_avx2(auVar62,0xee);
    local_198 = vpermq_avx2(auVar49,0xee);
    local_1b8 = vpermq_avx2(auVar4,0xee);
    dqcoeff_ptr[8] = 0;
    dqcoeff_ptr[9] = 0;
    dqcoeff_ptr[10] = 0;
    dqcoeff_ptr[0xb] = 0;
    dqcoeff_ptr[0xc] = 0;
    dqcoeff_ptr[0xd] = 0;
    dqcoeff_ptr[0xe] = 0;
    dqcoeff_ptr[0xf] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    dqcoeff_ptr[4] = 0;
    dqcoeff_ptr[5] = 0;
    dqcoeff_ptr[6] = 0;
    dqcoeff_ptr[7] = 0;
  }
  else {
    auVar55 = vpaddd_avx2(auVar65,auVar55);
    auVar56 = vpmuldq_avx2(auVar55,auVar62);
    auVar63 = vpsrlq_avx2(auVar55,0x20);
    auVar61 = vpsrlq_avx2(auVar62,0x20);
    auVar61 = vpmuldq_avx2(auVar63,auVar61);
    auVar56 = vpsrlq_avx2(auVar56,0x10);
    auVar61 = vpsllq_avx2(auVar61,0x10);
    auVar56 = vpblendd_avx2(auVar56,auVar61,0xaa);
    auVar55 = vpaddd_avx2(auVar56,auVar55);
    auVar56 = vpmuldq_avx2(auVar55,auVar49);
    auVar55 = vpsrlq_avx2(auVar55,0x20);
    auVar61 = vpsrlq_avx2(auVar49,0x20);
    auVar55 = vpmuldq_avx2(auVar55,auVar61);
    auVar56 = vpsrlq_avx2(auVar56,0xf);
    auVar55 = vpsllq_avx2(auVar55,0x11);
    auVar56 = vpblendd_avx2(auVar56,auVar55,0xaa);
    local_158 = vpermq_avx2(auVar65,0xee);
    local_178 = vpermq_avx2(auVar62,0xee);
    local_198 = vpermq_avx2(auVar49,0xee);
    auVar55 = vpaddd_avx2(auVar57,local_158);
    auVar57 = vpmuldq_avx2(auVar55,local_178);
    auVar62 = vpsrlq_avx2(auVar55,0x20);
    auVar61 = vpsrlq_avx2(local_178,0x20);
    auVar62 = vpmuldq_avx2(auVar62,auVar61);
    auVar57 = vpsrlq_avx2(auVar57,0x10);
    auVar62 = vpsllq_avx2(auVar62,0x10);
    auVar57 = vpblendd_avx2(auVar57,auVar62,0xaa);
    auVar55 = vpaddd_avx2(auVar57,auVar55);
    auVar57 = vpmuldq_avx2(auVar55,local_198);
    auVar55 = vpsrlq_avx2(auVar55,0x20);
    auVar62 = vpsrlq_avx2(local_198,0x20);
    auVar55 = vpmuldq_avx2(auVar55,auVar62);
    auVar57 = vpsrlq_avx2(auVar57,0xf);
    auVar55 = vpsllq_avx2(auVar55,0x11);
    auVar57 = vpblendd_avx2(auVar57,auVar55,0xaa);
    auVar55 = vpsignd_avx2(auVar56,*(undefined1 (*) [32])coeff_ptr);
    auVar57 = vpsignd_avx2(auVar57,*(undefined1 (*) [32])(coeff_ptr + 8));
    auVar62 = vpandn_avx2(auVar58,auVar55);
    auVar57 = vpand_avx2(auVar54,auVar57);
    *(undefined1 (*) [32])qcoeff_ptr = auVar62;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar57;
    auVar55 = vpabsd_avx2(auVar62);
    auVar56 = vpmuldq_avx2(auVar55,auVar4);
    auVar55 = vpsrlq_avx2(auVar55,0x20);
    auVar58 = vpsrlq_avx2(auVar4,0x20);
    auVar55 = vpmuldq_avx2(auVar55,auVar58);
    auVar56 = vpsrlq_avx2(auVar56,1);
    auVar55 = vpsllq_avx2(auVar55,0x1f);
    auVar55 = vpblendd_avx2(auVar56,auVar55,0xaa);
    auVar56 = vpsignd_avx2(auVar55,auVar62);
    local_1b8 = vpermq_avx2(auVar4,0xee);
    auVar55 = vpabsd_avx2(auVar57);
    auVar62 = vpmuldq_avx2(auVar55,local_1b8);
    auVar55 = vpsrlq_avx2(auVar55,0x20);
    auVar58 = vpsrlq_avx2(local_1b8,0x20);
    auVar55 = vpmuldq_avx2(auVar55,auVar58);
    auVar62 = vpsrlq_avx2(auVar62,1);
    auVar55 = vpsllq_avx2(auVar55,0x1f);
    auVar55 = vpblendd_avx2(auVar62,auVar55,0xaa);
    auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar55 = vpsignd_avx2(auVar55,auVar57);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar56;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar55;
  }
  auVar57 = vpmaxsw_avx2(auVar60,auVar61);
  auVar55 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar53);
  if (0x10 < n_coeffs) {
    auVar53 = vpsrad_avx2(local_178,0x1f);
    auVar62 = vpshufd_avx2(local_178,0xf5);
    auVar53 = vpblendd_avx2(auVar62,auVar53,0xaa);
    auVar60 = vpsrad_avx2(local_198,0x1f);
    auVar62 = vpshufd_avx2(local_198,0xf5);
    auVar60 = vpblendd_avx2(auVar62,auVar60,0xaa);
    auVar56 = vpsrad_avx2(local_1b8,0x1f);
    auVar62 = vpshufd_avx2(local_1b8,0xf5);
    auVar62 = vpblendd_avx2(auVar62,auVar56,0xaa);
    lVar40 = 0x10;
    do {
      auVar56 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar40));
      auVar58 = vpabsd_avx2(*(undefined1 (*) [32])(coeff_ptr + lVar40 + 8));
      auVar54 = vpslld_avx2(auVar56,5);
      auVar54 = vpcmpgtd_avx2(auVar54,auVar47);
      auVar61 = vpslld_avx2(auVar58,5);
      auVar61 = vpcmpgtd_avx2(auVar61,auVar47);
      auVar54 = vpackssdw_avx2(auVar54,auVar61);
      auVar61 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((((((((((((((((((((((((((auVar54 >> 7 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar54 >> 0xf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar54 >> 0x17 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar54 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar54 >> 0x27 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar54 >> 0x2f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar54 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar54 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar54 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar54 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar54 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar54 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar54 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar54 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar54 >> 0x7f,0) != '\0') ||
                        (auVar54 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar54 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar54 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar54 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar54 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar54 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar54 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar54 >> 0xbf,0) != '\0') ||
                (auVar54 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar54 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar54 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar54 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar54 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar54 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar54 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          auVar54[0x1f] < '\0') {
        auVar54 = vpermq_avx2(auVar54,0xd8);
        auVar61 = vpand_avx2(auVar54,*(undefined1 (*) [32])(iscan + lVar40));
        bVar46 = true;
      }
      auVar65 = vpcmpgtd_avx2(auVar56,auVar5);
      auVar4 = vpcmpgtd_avx2(auVar58,auVar5);
      auVar54 = vpackssdw_avx2(auVar65,auVar4);
      auVar49 = vpermq_avx2(auVar54,0xd8);
      if ((((((((((((((((((((((((((((((((auVar54 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar54 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar54 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar54 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar54 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar54 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar54 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar54 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar54 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar54 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar54 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar54 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar54 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar54 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar54 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar54 >> 0x7f,0) == '\0') &&
                        (auVar54 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar54 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar54 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar54 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar54 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar54 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar54 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar54 >> 0xbf,0) == '\0') &&
                (auVar54 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar54 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar54 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar54 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar54 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar54 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar54 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar54[0x1f])
      {
        auVar54 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      }
      else {
        auVar54 = vpand_avx2(auVar49,*(undefined1 (*) [32])(iscan + lVar40));
        bVar6 = true;
      }
      if ((((((((((((((((((((((((((((((((auVar49 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar49 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar49 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar49 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar49 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar49 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar49 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar49 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar49 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar49 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar49 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar49 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar49 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar49 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar49 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar49 >> 0x7f,0) == '\0') &&
                        (auVar49 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar49 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar49 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar49 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar49 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar49 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar49 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar49 >> 0xbf,0) == '\0') &&
                (auVar49 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar49 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar49 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar49 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar49 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar49 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar49 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar49[0x1f])
      {
        ptVar1 = qcoeff_ptr + lVar40 + 8;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = qcoeff_ptr + lVar40;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = dqcoeff_ptr + lVar40 + 8;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
        ptVar1 = dqcoeff_ptr + lVar40;
        ptVar1[0] = 0;
        ptVar1[1] = 0;
        ptVar1[2] = 0;
        ptVar1[3] = 0;
        ptVar1[4] = 0;
        ptVar1[5] = 0;
        ptVar1[6] = 0;
        ptVar1[7] = 0;
      }
      else {
        auVar56 = vpaddd_avx2(local_158,auVar56);
        auVar63 = vpmuldq_avx2(auVar56,local_178);
        auVar48 = vpsrad_avx2(auVar56,0x1f);
        auVar59 = vpshufd_avx2(auVar56,0xf5);
        auVar64 = vpsrlq_avx2(auVar53,0x20);
        auVar49 = vpmuludq_avx2(auVar64,auVar59);
        auVar48 = vpsrlq_avx2(auVar48,0x20);
        auVar48 = vpmuludq_avx2(auVar53,auVar48);
        auVar49 = vpaddq_avx2(auVar49,auVar48);
        auVar48 = vpsllq_avx2(auVar49,0x20);
        auVar49 = vpmuludq_avx2(auVar53,auVar59);
        auVar49 = vpaddq_avx2(auVar49,auVar48);
        auVar63 = vpsrlq_avx2(auVar63,0x10);
        auVar49 = vpsllq_avx2(auVar49,0x10);
        auVar49 = vpblendd_avx2(auVar63,auVar49,0xaa);
        auVar56 = vpaddd_avx2(auVar49,auVar56);
        auVar63 = vpsrad_avx2(auVar56,0x1f);
        auVar48 = vpshufd_avx2(auVar56,0xf5);
        auVar59 = vpsrlq_avx2(auVar60,0x20);
        auVar49 = vpmuludq_avx2(auVar48,auVar59);
        auVar63 = vpsrlq_avx2(auVar63,0x20);
        auVar63 = vpmuludq_avx2(auVar60,auVar63);
        auVar49 = vpaddq_avx2(auVar49,auVar63);
        auVar63 = vpmuldq_avx2(auVar56,local_198);
        auVar49 = vpsllq_avx2(auVar49,0x20);
        auVar56 = vpmuludq_avx2(auVar60,auVar48);
        auVar56 = vpaddq_avx2(auVar56,auVar49);
        auVar49 = vpsrlq_avx2(auVar63,0xf);
        auVar56 = vpsllq_avx2(auVar56,0x11);
        auVar48 = vpblendd_avx2(auVar49,auVar56,0xaa);
        auVar56 = vpaddd_avx2(local_158,auVar58);
        auVar49 = vpsrad_avx2(auVar56,0x1f);
        auVar63 = vpshufd_avx2(auVar56,0xf5);
        auVar58 = vpmuludq_avx2(auVar64,auVar63);
        auVar49 = vpsrlq_avx2(auVar49,0x20);
        auVar49 = vpmuludq_avx2(auVar53,auVar49);
        auVar58 = vpaddq_avx2(auVar58,auVar49);
        auVar49 = vpsllq_avx2(auVar58,0x20);
        auVar58 = vpmuludq_avx2(auVar53,auVar63);
        auVar58 = vpaddq_avx2(auVar58,auVar49);
        auVar49 = vpmuldq_avx2(auVar56,local_178);
        auVar49 = vpsrlq_avx2(auVar49,0x10);
        auVar58 = vpsllq_avx2(auVar58,0x10);
        auVar58 = vpblendd_avx2(auVar49,auVar58,0xaa);
        auVar56 = vpaddd_avx2(auVar58,auVar56);
        auVar49 = vpsrad_avx2(auVar56,0x1f);
        auVar63 = vpshufd_avx2(auVar56,0xf5);
        auVar58 = vpmuludq_avx2(auVar63,auVar59);
        auVar49 = vpsrlq_avx2(auVar49,0x20);
        auVar49 = vpmuludq_avx2(auVar60,auVar49);
        auVar58 = vpaddq_avx2(auVar58,auVar49);
        auVar49 = vpsllq_avx2(auVar58,0x20);
        auVar58 = vpmuludq_avx2(auVar60,auVar63);
        auVar58 = vpaddq_avx2(auVar58,auVar49);
        auVar56 = vpmuldq_avx2(auVar56,local_198);
        auVar56 = vpsrlq_avx2(auVar56,0xf);
        auVar58 = vpsllq_avx2(auVar58,0x11);
        auVar58 = vpblendd_avx2(auVar56,auVar58,0xaa);
        auVar56 = vpsignd_avx2(auVar48,*(undefined1 (*) [32])(coeff_ptr + lVar40));
        auVar58 = vpsignd_avx2(auVar58,*(undefined1 (*) [32])(coeff_ptr + lVar40 + 8));
        auVar65 = vpand_avx2(auVar65,auVar56);
        auVar4 = vpand_avx2(auVar4,auVar58);
        auVar56 = vpabsd_avx2(auVar65);
        auVar49 = vpsrad_avx2(auVar56,0x1f);
        auVar63 = vpshufd_avx2(auVar56,0xf5);
        auVar48 = vpsrlq_avx2(auVar62,0x20);
        auVar58 = vpmuludq_avx2(auVar63,auVar48);
        auVar49 = vpsrlq_avx2(auVar49,0x20);
        auVar49 = vpmuludq_avx2(auVar62,auVar49);
        auVar58 = vpaddq_avx2(auVar58,auVar49);
        *(undefined1 (*) [32])(qcoeff_ptr + lVar40) = auVar65;
        auVar49 = vpmuldq_avx2(auVar56,local_1b8);
        auVar58 = vpsllq_avx2(auVar58,0x20);
        auVar56 = vpmuludq_avx2(auVar62,auVar63);
        auVar56 = vpaddq_avx2(auVar56,auVar58);
        auVar58 = vpsrlq_avx2(auVar49,1);
        auVar56 = vpsllq_avx2(auVar56,0x1f);
        auVar56 = vpblendd_avx2(auVar58,auVar56,0xaa);
        auVar63 = vpsignd_avx2(auVar56,auVar65);
        auVar56 = vpabsd_avx2(auVar4);
        auVar65 = vpsrad_avx2(auVar56,0x1f);
        auVar49 = vpshufd_avx2(auVar56,0xf5);
        auVar58 = vpmuludq_avx2(auVar49,auVar48);
        auVar65 = vpsrlq_avx2(auVar65,0x20);
        auVar65 = vpmuludq_avx2(auVar62,auVar65);
        auVar58 = vpaddq_avx2(auVar58,auVar65);
        auVar65 = vpsllq_avx2(auVar58,0x20);
        auVar58 = vpmuludq_avx2(auVar62,auVar49);
        auVar58 = vpaddq_avx2(auVar58,auVar65);
        auVar56 = vpmuldq_avx2(auVar56,local_1b8);
        auVar56 = vpsrlq_avx2(auVar56,1);
        auVar58 = vpsllq_avx2(auVar58,0x1f);
        auVar56 = vpblendd_avx2(auVar56,auVar58,0xaa);
        *(undefined1 (*) [32])(qcoeff_ptr + lVar40 + 8) = auVar4;
        auVar56 = vpsignd_avx2(auVar56,auVar4);
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar40) = auVar63;
        *(undefined1 (*) [32])(dqcoeff_ptr + lVar40 + 8) = auVar56;
      }
      auVar57 = vpmaxsw_avx2(auVar61,auVar57);
      auVar55 = vpmaxsw_avx2(auVar54,auVar55);
      lVar40 = lVar40 + 0x10;
    } while (lVar40 < n_coeffs);
  }
  if (bVar46) {
    auVar3 = vpmaxsw_avx(auVar57._0_16_,auVar57._16_16_);
    auVar50 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmaxsw_avx(auVar50,auVar3);
    auVar50 = vpshufd_avx(auVar3,1);
    auVar3 = vpmaxsw_avx(auVar50,auVar3);
    auVar50 = vpsrld_avx(auVar3,0x10);
    auVar3 = vpmaxsw_avx(auVar3,auVar50);
    iVar41 = vpextrw_avx(auVar3,0);
    uVar42 = iVar41 + 1;
  }
  else {
    uVar42 = 0;
  }
  if (bVar6) {
    auVar3 = vpmaxsw_avx(auVar55._0_16_,auVar55._16_16_);
    auVar50 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmaxsw_avx(auVar50,auVar3);
    auVar50 = vpshufd_avx(auVar3,1);
    auVar3 = vpmaxsw_avx(auVar50,auVar3);
    auVar50 = vpsrld_avx(auVar3,0x10);
    auVar3 = vpmaxsw_avx(auVar3,auVar50);
    uVar39 = vpextrw_avx(auVar3,0);
  }
  else {
    uVar39 = 0xffffffff;
  }
  if ((int)uVar42 <= (int)uVar39) {
    iVar41 = uVar39 + 1;
    psVar44 = scan + uVar39;
    do {
      sVar2 = *psVar44;
      qcoeff_ptr[sVar2] = 0;
      dqcoeff_ptr[sVar2] = 0;
      iVar41 = iVar41 + -1;
      psVar44 = psVar44 + -1;
    } while ((int)uVar42 < iVar41);
  }
  uVar45 = 0xffffffff;
  uVar38 = (ulong)uVar42;
  do {
    iVar41 = (int)uVar45;
    if ((long)uVar38 < 1) break;
    lVar40 = uVar38 - 1;
    uVar38 = uVar38 - 1;
    if (qcoeff_ptr[scan[lVar40]] != 0) {
      uVar45 = uVar38 & 0xffffffff;
    }
    iVar41 = (int)uVar45;
  } while (qcoeff_ptr[scan[lVar40]] == 0);
  uVar43 = (uint16_t)(iVar41 + 1U);
  *eob_ptr = uVar43;
  if (uVar42 == 0) {
    uVar39 = 0xffffffff;
  }
  else {
    lVar40 = 0;
    do {
      uVar39 = (uint)lVar40;
      if (qcoeff_ptr[scan[lVar40]] != 0) break;
      bVar46 = (ulong)uVar42 - 1 != lVar40;
      lVar40 = lVar40 + 1;
      uVar39 = 0xffffffff;
    } while (bVar46);
  }
  if ((uVar43 != 0) && (uVar42 = (iVar41 + 1U & 0xffff) - 1, uVar39 == uVar42)) {
    sVar2 = scan[uVar42];
    if (((qcoeff_ptr[sVar2] == 1) || (qcoeff_ptr[sVar2] == -1)) &&
       (uVar42 = coeff_ptr[sVar2] >> 0x1f,
       (int)((coeff_ptr[sVar2] << 5 ^ uVar42) - uVar42) <
       *(int *)(local_1b8 + (ulong)(sVar2 != 0) * 4 + -8) * 0x20 +
       (dequant_ptr[sVar2 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar2] = 0;
      dqcoeff_ptr[sVar2] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_32x32_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const int log_scale = 1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff0, qcoeff0, coeff1, qcoeff1;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  const __m256i one = _mm256_set1_epi32(1);
  const __m256i log_scale_vec = _mm256_set1_epi32(log_scale);
  int prescan_add[2];
  int thresh[2];
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  zbin = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)zbin_ptr));
  round = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)round_ptr));
  quant = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)quant_ptr));
  dequant = _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)dequant_ptr));
  shift =
      _mm256_cvtepi16_epi32(_mm_load_si128((const __m128i *)quant_shift_ptr));

  // Shift with rounding.
  zbin = _mm256_add_epi32(zbin, log_scale_vec);
  round = _mm256_add_epi32(round, log_scale_vec);
  zbin = _mm256_srli_epi32(zbin, log_scale);
  round = _mm256_srli_epi32(round, log_scale);
  zbin = _mm256_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr));
  qcoeff0 = _mm256_abs_epi32(coeff0);
  coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + 8));
  qcoeff1 = _mm256_abs_epi32(coeff1);
  highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0,
                           &mask0);
  __m256i temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm256_permute2x128_si256(zbin, zbin, 0x11);
  __m256i temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
  highbd_update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_permute2x128_si256(round, round, 0x11);
    quant = _mm256_permute2x128_si256(quant, quant, 0x11);
    shift = _mm256_permute2x128_si256(shift, shift, 0x11);
    dequant = _mm256_permute2x128_si256(dequant, dequant, 0x11);
  } else {
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    round = _mm256_permute2x128_si256(round, round, 0x11);
    quant = _mm256_permute2x128_si256(quant, quant, 0x11);
    shift = _mm256_permute2x128_si256(shift, shift, 0x11);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    // Reinsert signs
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    // Mask out zbin threshold coeffs
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr);
    coeff0 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0, dequant, log_scale);
    dequant = _mm256_permute2x128_si256(dequant, dequant, 0x11);
    coeff1 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff1, dequant, log_scale);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm256_load_si256((__m256i *)(coeff_ptr + index));
    qcoeff0 = _mm256_abs_epi32(coeff0);
    coeff1 = _mm256_load_si256((__m256i *)(coeff_ptr + index + 8));
    qcoeff1 = _mm256_abs_epi32(coeff1);
    highbd_update_mask0_avx2(&qcoeff0, &qcoeff1, threshold, iscan + index,
                             &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi32(qcoeff0, zbin);
    temp1 = _mm256_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm256_permute4x64_epi64(_mm256_packs_epi32(temp0, temp1), 0xd8);
    highbd_update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    highbd_calculate_qcoeff_avx2(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff_avx2(&qcoeff1, &round, &quant, &shift, &log_scale);
    qcoeff0 = _mm256_sign_epi32(qcoeff0, coeff0);
    qcoeff1 = _mm256_sign_epi32(qcoeff1, coeff1);
    qcoeff0 = _mm256_and_si256(qcoeff0, temp0);
    qcoeff1 = _mm256_and_si256(qcoeff1, temp1);
    highbd_store_coefficients_avx2(qcoeff0, qcoeff1, qcoeff_ptr + index);
    coeff0 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff0, dequant, log_scale);
    coeff1 =
        highbd_calculate_dqcoeff_log_scale_avx2(qcoeff1, dequant, log_scale);
    highbd_store_coefficients_avx2(coeff0, coeff1, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}